

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateInfo::Deserialize(CreateInfo *this,Deserializer *deserializer)

{
  _Elt_pointer puVar1;
  CatalogType CVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  OnCreateConflict OVar5;
  int iVar6;
  uint uVar7;
  _func_int **pp_Var8;
  pointer pCVar9;
  SerializationException *this_00;
  pointer *__ptr;
  uint uVar10;
  Value comment;
  type ret_2;
  type ret_1;
  type ret;
  LogicalDependencyList dependencies;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  undefined1 local_228 [32];
  Value local_208;
  _Map_pointer local_1c8;
  undefined1 local_1c0 [24];
  reference_wrapper<duckdb::DatabaseInstance> *local_1a8;
  __node_base local_1a0;
  reference_wrapper<duckdb::DatabaseInstance> local_198 [2];
  reference_wrapper<duckdb::DatabaseInstance> *local_188;
  __node_base_ptr local_180;
  reference_wrapper<duckdb::DatabaseInstance> local_178 [2];
  LogicalType local_168;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_150;
  type local_118;
  undefined1 local_e0 [32];
  pointer local_c0;
  __node_base local_b8;
  undefined1 auStack_b0 [8];
  pointer local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer pVStack_90;
  _Alloc_hider local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 auStack_78 [72];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_208,deserializer);
    CVar2 = EnumUtil::FromString<duckdb::CatalogType>((char *)local_208.type_._0_8_);
    uVar10 = (uint)CVar2;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_208.type_._0_8_ !=
        &local_208.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_208.type_._0_8_);
    }
  }
  else {
    uVar10 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"catalog");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_188 = local_178;
    local_178[0]._M_data._0_1_ = INVALID;
    local_180 = (__node_base_ptr)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_188,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"schema");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_1a8 = local_198;
    local_198[0]._M_data._0_1_ = 0;
    local_1a0._M_nxt = (_Hash_node_base *)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_1a8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"temporary");
  pp_Var8 = deserializer->_vptr_Deserializer;
  if ((char)uVar7 == '\0') {
    uVar3 = false;
  }
  else {
    iVar6 = (*pp_Var8[0xc])(deserializer);
    uVar3 = (undefined1)iVar6;
    pp_Var8 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var8[5])(deserializer,(ulong)(uVar7 & 0xff));
  uVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"internal");
  pp_Var8 = deserializer->_vptr_Deserializer;
  if ((char)uVar7 == '\0') {
    uVar4 = false;
  }
  else {
    iVar6 = (*pp_Var8[0xc])(deserializer);
    uVar4 = (undefined1)iVar6;
    pp_Var8 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var8[5])(deserializer,(ulong)(uVar7 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x69,"on_conflict");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_208,deserializer);
    OVar5 = EnumUtil::FromString<duckdb::OnCreateConflict>((char *)local_208.type_._0_8_);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_208.type_._0_8_ !=
        &local_208.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_208.type_._0_8_);
    }
  }
  else {
    iVar6 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar5 = (OnCreateConflict)iVar6;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6a,"sql");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_1c8 = (_Map_pointer)(local_1c0 + 8);
    local_1c0[8] = '\0';
    local_1c0._0_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_1c8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  LogicalType::LogicalType(&local_168,SQLNULL);
  Value::Value((Value *)(auStack_78 + 8),&local_168);
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6b,"comment");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    Value::Value(&local_208,(Value *)(auStack_78 + 8));
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    Value::Deserialize(&local_208,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Value::~Value((Value *)(auStack_78 + 8));
  LogicalType::~LogicalType(&local_168);
  local_a8 = (pointer)auStack_78;
  local_a0._M_allocated_capacity = (size_type)&DAT_00000001;
  local_a0._8_8_ = (pointer)0x0;
  pVStack_90 = (pointer)0x0;
  local_88._M_p = (pointer)0x3f800000;
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_78._0_8_ = (_Elt_pointer)0x0;
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6c,"tags");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&local_118,&local_a8);
  }
  else {
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
              (&local_118,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_a8);
  local_e0._0_8_ = auStack_b0;
  local_e0._8_8_ = &DAT_00000001;
  local_e0._16_8_ = (pointer)0x0;
  local_e0._24_8_ = (__buckets_ptr)0x0;
  local_c0 = (pointer)0x3f800000;
  local_b8._M_nxt = (_Hash_node_base *)0x0;
  auStack_b0 = (undefined1  [8])0x0;
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6d,"dependencies");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    ::std::
    _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_Hashtable(&local_150,local_e0);
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    LogicalDependencyList::Deserialize((LogicalDependencyList *)&local_150,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_e0);
  uVar10 = uVar10 & 0xff;
  local_228._0_8_ = ZEXT48(uVar10);
  puVar1 = (deserializer->data).enums.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (deserializer->data).enums.c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(deserializer->data).enums.c,(unsigned_long *)local_228);
  }
  else {
    *puVar1 = local_228._0_8_;
    (deserializer->data).enums.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar1 + 1;
  }
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)0x0;
  switch(uVar10) {
  case 1:
    CreateTableInfo::Deserialize((CreateTableInfo *)local_228,deserializer);
    break;
  case 2:
    CreateSchemaInfo::Deserialize((Deserializer *)local_228);
    break;
  case 3:
    CreateViewInfo::Deserialize((CreateViewInfo *)local_228,deserializer);
    break;
  case 4:
    CreateIndexInfo::Deserialize((CreateIndexInfo *)local_228,deserializer);
    break;
  case 5:
  case 7:
switchD_0108dcea_caseD_5:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_228._0_8_ = local_228 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,"Unsupported type for deserialization of CreateInfo!","");
    SerializationException::SerializationException(this_00,(string *)local_228);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 6:
    CreateSequenceInfo::Deserialize((CreateSequenceInfo *)local_228,deserializer);
    break;
  case 8:
    CreateTypeInfo::Deserialize((CreateTypeInfo *)local_228,deserializer);
    break;
  default:
    if (uVar10 == 0x1e) {
      CreateMacroInfo::Deserialize((CreateMacroInfo *)local_228,deserializer);
    }
    else {
      if (uVar10 != 0x1f) goto switchD_0108dcea_caseD_5;
      CreateMacroInfo::Deserialize((CreateMacroInfo *)local_228,deserializer);
    }
  }
  pp_Var8 = (this->super_ParseInfo)._vptr_ParseInfo;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_228._0_8_;
  if (pp_Var8 != (_func_int **)0x0) {
    (**(code **)(*pp_Var8 + 8))();
  }
  Deserializer::Unset<duckdb::CatalogType>(deserializer);
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  ::std::__cxx11::string::operator=((string *)&pCVar9->catalog,(string *)&local_188);
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  ::std::__cxx11::string::operator=((string *)&pCVar9->schema,(string *)&local_1a8);
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  pCVar9->temporary = (bool)uVar3;
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  pCVar9->internal = (bool)uVar4;
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  pCVar9->on_conflict = OVar5;
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  ::std::__cxx11::string::operator=((string *)&pCVar9->sql,(string *)&local_1c8);
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  Value::operator=(&pCVar9->comment,&local_208);
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&pCVar9->tags,&local_118);
  pCVar9 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)this);
  if (&local_150 !=
      (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)&pCVar9->dependencies) {
    ::std::
    _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pCVar9->dependencies,&local_150);
  }
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_150);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_118);
  Value::~Value(&local_208);
  if (local_1c8 != (_Map_pointer)(local_1c0 + 8)) {
    operator_delete(local_1c8);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<CatalogType>(100, "type");
	auto catalog = deserializer.ReadPropertyWithDefault<string>(101, "catalog");
	auto schema = deserializer.ReadPropertyWithDefault<string>(102, "schema");
	auto temporary = deserializer.ReadPropertyWithDefault<bool>(103, "temporary");
	auto internal = deserializer.ReadPropertyWithDefault<bool>(104, "internal");
	auto on_conflict = deserializer.ReadProperty<OnCreateConflict>(105, "on_conflict");
	auto sql = deserializer.ReadPropertyWithDefault<string>(106, "sql");
	auto comment = deserializer.ReadPropertyWithExplicitDefault<Value>(107, "comment", Value());
	auto tags = deserializer.ReadPropertyWithExplicitDefault<unordered_map<string, string>>(108, "tags", unordered_map<string, string>());
	auto dependencies = deserializer.ReadPropertyWithExplicitDefault<LogicalDependencyList>(109, "dependencies", LogicalDependencyList());
	deserializer.Set<CatalogType>(type);
	unique_ptr<CreateInfo> result;
	switch (type) {
	case CatalogType::INDEX_ENTRY:
		result = CreateIndexInfo::Deserialize(deserializer);
		break;
	case CatalogType::MACRO_ENTRY:
		result = CreateMacroInfo::Deserialize(deserializer);
		break;
	case CatalogType::SCHEMA_ENTRY:
		result = CreateSchemaInfo::Deserialize(deserializer);
		break;
	case CatalogType::SEQUENCE_ENTRY:
		result = CreateSequenceInfo::Deserialize(deserializer);
		break;
	case CatalogType::TABLE_ENTRY:
		result = CreateTableInfo::Deserialize(deserializer);
		break;
	case CatalogType::TABLE_MACRO_ENTRY:
		result = CreateMacroInfo::Deserialize(deserializer);
		break;
	case CatalogType::TYPE_ENTRY:
		result = CreateTypeInfo::Deserialize(deserializer);
		break;
	case CatalogType::VIEW_ENTRY:
		result = CreateViewInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of CreateInfo!");
	}
	deserializer.Unset<CatalogType>();
	result->catalog = std::move(catalog);
	result->schema = std::move(schema);
	result->temporary = temporary;
	result->internal = internal;
	result->on_conflict = on_conflict;
	result->sql = std::move(sql);
	result->comment = comment;
	result->tags = std::move(tags);
	result->dependencies = dependencies;
	return result;
}